

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O1

long oggpack_read(oggpack_buffer *b,int bits)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  byte *pbVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  if ((uint)bits < 0x21) {
    uVar2 = mask[(uint)bits];
    iVar1 = b->endbit;
    uVar7 = bits + iVar1;
    lVar3 = b->endbyte;
    if (b->storage + -4 <= lVar3) {
      if (b->storage - (long)((int)(uVar7 + 7) >> 3) < lVar3) goto LAB_001e48ed;
      if (uVar7 == 0) {
        return 0;
      }
    }
    pbVar4 = b->ptr;
    bVar5 = (byte)iVar1;
    uVar8 = (ulong)(*pbVar4 >> (bVar5 & 0x1f));
    if ((((8 < (int)uVar7) &&
         (uVar8 = (long)(int)((uint)pbVar4[1] << (8 - bVar5 & 0x1f)) | uVar8, 0x10 < (int)uVar7)) &&
        (uVar8 = uVar8 | (long)(int)((uint)pbVar4[2] << (0x10 - bVar5 & 0x1f)), 0x18 < (int)uVar7))
       && (uVar8 = uVar8 | (long)(int)((uint)pbVar4[3] << (0x18 - bVar5 & 0x1f)),
          iVar1 != 0 && 0x20 < (int)uVar7)) {
      uVar8 = uVar8 | (long)(int)((uint)pbVar4[4] << (-bVar5 & 0x1f));
    }
    uVar6 = uVar7 + 7;
    if (-1 < (int)uVar7) {
      uVar6 = uVar7;
    }
    b->ptr = pbVar4 + ((int)uVar6 >> 3);
    b->endbyte = lVar3 + ((int)uVar6 >> 3);
    b->endbit = uVar7 & 7;
    return uVar8 & uVar2;
  }
LAB_001e48ed:
  b->ptr = (uchar *)0x0;
  b->endbyte = b->storage;
  b->endbit = 1;
  return -1;
}

Assistant:

long oggpack_read(oggpack_buffer *b,int bits){
  long ret;
  unsigned long m;

  if(bits<0 || bits>32) goto err;
  m=mask[bits];
  bits+=b->endbit;

  if(b->endbyte >= b->storage-4){
    /* not the main path */
    if(b->endbyte > b->storage-((bits+7)>>3)) goto overflow;
    /* special case to avoid reading b->ptr[0], which might be past the end of
        the buffer; also skips some useless accounting */
    else if(!bits)return(0L);
  }

  ret=b->ptr[0]>>b->endbit;
  if(bits>8){
    ret|=b->ptr[1]<<(8-b->endbit);
    if(bits>16){
      ret|=b->ptr[2]<<(16-b->endbit);
      if(bits>24){
        ret|=b->ptr[3]<<(24-b->endbit);
        if(bits>32 && b->endbit){
          ret|=b->ptr[4]<<(32-b->endbit);
        }
      }
    }
  }
  ret&=m;
  b->ptr+=bits/8;
  b->endbyte+=bits/8;
  b->endbit=bits&7;
  return ret;

 overflow:
 err:
  b->ptr=NULL;
  b->endbyte=b->storage;
  b->endbit=1;
  return -1L;
}